

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::handleErrorsFromImports
          (ValidatorImpl *this,size_t initialErrorCount,bool isOriginatingModel,string *type,
          string *name,History *history,ComponentPtr *component,UnitsPtr *units)

{
  Logger *this_00;
  IssueImpl *pIVar1;
  bool bVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  ostream *poVar6;
  reference pvVar7;
  element_type *peVar8;
  const_reference pvVar9;
  element_type *peVar10;
  string local_318;
  undefined1 local_2f8 [8];
  value_type h;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  Strings ss;
  string importInfo;
  size_t endMarker;
  size_t startMarker;
  size_t originalDescriptionStart;
  size_t pos;
  size_t depth;
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string description;
  IssuePtr issue;
  size_t i;
  allocator<char> local_39;
  History *local_38;
  History *history_local;
  string *name_local;
  string *type_local;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_18;
  bool isOriginatingModel_local;
  size_t initialErrorCount_local;
  ValidatorImpl *this_local;
  
  local_38 = history;
  history_local = (History *)name;
  name_local = type;
  type_local._7_1_ = isOriginatingModel;
  p_Stack_18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)initialErrorCount;
  initialErrorCount_local = (size_t)this;
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::skipThis_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::skipThis_abi_cxx11_,initialErrorCount,component), iVar3 != 0))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::skipThis_abi_cxx11_,"Cyclic dependencies",&local_39);
    std::allocator<char>::~allocator(&local_39);
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::skipThis_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::skipThis_abi_cxx11_);
  }
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::notOriginMarker_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::notOriginMarker_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::notOriginMarker_abi_cxx11_,"NOT ORIGIN: ",(allocator<char> *)((long)&i + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::notOriginMarker_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::notOriginMarker_abi_cxx11_);
  }
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::dataBoundaryMarker_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::dataBoundaryMarker_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::dataBoundaryMarker_abi_cxx11_,"&",(allocator<char> *)((long)&i + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::dataBoundaryMarker_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::dataBoundaryMarker_abi_cxx11_);
  }
  if ((handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
       ::dataSeparator_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                   ::dataSeparator_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                ::dataSeparator_abi_cxx11_,";",(allocator<char> *)((long)&i + 1));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 1));
    __cxa_atexit(std::__cxx11::string::~string,
                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                  ::dataSeparator_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                         ::dataSeparator_abi_cxx11_);
  }
  for (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            p_Stack_18;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               Logger::issueCount(&this->mValidator->super_Logger),
      issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      p_Var4; issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(issue.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
    this_00 = (Logger *)((long)&description.field_2 + 8);
    Logger::issue(this_00,(size_t)this->mValidator);
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
    Issue::description_abi_cxx11_((string *)local_88,peVar5);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_88);
    bVar2 = std::operator!=(&local_a8,
                            &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                             ::skipThis_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&depth);
      if ((type_local._7_1_ & 1) == 0) {
        pvVar9 = std::
                 vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                 ::back(local_38);
        std::shared_ptr<libcellml::HistoryEpoch>::shared_ptr
                  ((shared_ptr<libcellml::HistoryEpoch> *)local_2f8,pvVar9);
        poVar6 = std::operator<<((ostream *)&depth,
                                 (string *)
                                 &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                  ::notOriginMarker_abi_cxx11_);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataBoundaryMarker_abi_cxx11_);
        peVar10 = std::
                  __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_2f8);
        poVar6 = std::operator<<(poVar6,(string *)&peVar10->mName);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataSeparator_abi_cxx11_);
        peVar10 = std::
                  __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_2f8);
        poVar6 = std::operator<<(poVar6,(string *)&peVar10->mReferenceName);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataSeparator_abi_cxx11_);
        peVar10 = std::
                  __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_2f8);
        poVar6 = std::operator<<(poVar6,(string *)&peVar10->mDestinationUrl);
        poVar6 = std::operator<<(poVar6,(string *)
                                        &handleErrorsFromImports(unsigned_long,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<libcellml::HistoryEpoch>,std::allocator<std::shared_ptr<libcellml::HistoryEpoch>>>const&,std::shared_ptr<libcellml::Component>const&,std::shared_ptr<libcellml::Units>const&)
                                         ::dataBoundaryMarker_abi_cxx11_);
        std::operator<<(poVar6,(string *)local_88);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(description.field_2._M_local_buf + 8));
        pIVar1 = peVar5->mPimpl;
        std::__cxx11::ostringstream::str();
        Issue::IssueImpl::setDescription(pIVar1,&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        std::shared_ptr<libcellml::HistoryEpoch>::~shared_ptr
                  ((shared_ptr<libcellml::HistoryEpoch> *)local_2f8);
      }
      else {
        pos = 0;
        originalDescriptionStart = std::__cxx11::string::find((string *)local_88,0x472880);
        while (originalDescriptionStart != 0xffffffffffffffff) {
          if (pos == 0) {
            std::operator<<((ostream *)&depth,"Imported ");
            bVar2 = std::operator==(name_local,"Component");
            if (bVar2) {
              std::operator<<((ostream *)&depth,"component ");
            }
            else {
              std::operator<<((ostream *)&depth,"units ");
            }
            poVar6 = std::operator<<((ostream *)&depth,"\'");
            poVar6 = std::operator<<(poVar6,(string *)history_local);
            poVar6 = std::operator<<(poVar6,"\' is not valid because:");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          std::__cxx11::string::find((string *)local_88,0x4728a8);
          std::__cxx11::string::find((string *)local_88,0x4728a8);
          std::__cxx11::string::substr
                    ((ulong)&ss.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_88);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,";",&local_2a1);
          split((Strings *)local_280,
                (string *)
                &ss.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator(&local_2a1);
          poVar6 = std::operator<<((ostream *)&depth,"  -> ");
          poVar6 = std::operator<<(poVar6,(string *)name_local);
          poVar6 = std::operator<<(poVar6," \'");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_280,0);
          poVar6 = std::operator<<(poVar6,(string *)pvVar7);
          poVar6 = std::operator<<(poVar6,"\' importing \'");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_280,1);
          poVar6 = std::operator<<(poVar6,(string *)pvVar7);
          poVar6 = std::operator<<(poVar6,"\' from \'");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_280,2);
          poVar6 = std::operator<<(poVar6,(string *)pvVar7);
          std::operator<<(poVar6,"\'");
          originalDescriptionStart = std::__cxx11::string::find((string *)local_88,0x472880);
          pos = pos + 1;
          if (originalDescriptionStart == 0xffffffffffffffff) {
            if (1 < pos) {
              std::operator<<((ostream *)&depth," which");
            }
            poVar6 = std::operator<<((ostream *)&depth," has an error:");
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::operator<<(poVar6,"   - ");
          }
          else {
            poVar6 = std::operator<<((ostream *)&depth," imports:");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_280);
          std::__cxx11::string::~string
                    ((string *)
                     &ss.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (pos != 0) {
          bVar2 = std::operator==(name_local,"Component");
          if (bVar2) {
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(description.field_2._M_local_buf + 8));
            peVar8 = std::
                     __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar5->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setComponent(peVar8->mPimpl,component,COMPONENT)
            ;
          }
          else {
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(description.field_2._M_local_buf + 8));
            peVar8 = std::
                     __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar5->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar8->mPimpl,units);
          }
        }
        std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_88);
        std::operator<<((ostream *)&depth,local_2c8);
        std::__cxx11::string::~string(local_2c8);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(description.field_2._M_local_buf + 8));
        pIVar1 = peVar5->mPimpl;
        std::__cxx11::ostringstream::str();
        Issue::IssueImpl::setDescription
                  (pIVar1,(string *)
                          &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
        std::__cxx11::string::~string
                  ((string *)
                   &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depth);
    }
    std::__cxx11::string::~string((string *)local_88);
    std::shared_ptr<libcellml::Issue>::~shared_ptr
              ((shared_ptr<libcellml::Issue> *)((long)&description.field_2 + 8));
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::handleErrorsFromImports(size_t initialErrorCount, bool isOriginatingModel, const std::string &type, const std::string &name, const History &history, const ComponentPtr &component, const UnitsPtr &units) const
{
    static const std::string skipThis = "Cyclic dependencies";
    static const std::string notOriginMarker = "NOT ORIGIN: ";
    static const std::string dataBoundaryMarker = "&";
    static const std::string dataSeparator = ";";

    for (size_t i = initialErrorCount; i < mValidator->issueCount(); ++i) {
        auto issue = mValidator->issue(i);
        auto description = issue->description();
        if (description.substr(0, skipThis.length()) != skipThis) {
            std::ostringstream os;
            if (isOriginatingModel) {
                // If error is not from this model then set this component or units.
                size_t depth = 0;
                size_t pos = description.find(notOriginMarker);
                size_t originalDescriptionStart = 0;
                while (pos != std::string::npos) {
                    if (depth == 0) {
                        os << "Imported ";
                        if (type == "Component") {
                            os << "component ";
                        } else {
                            os << "units ";
                        }
                        os << "'" << name << "' is not valid because:" << std::endl;
                    }
                    size_t startMarker = description.find(dataBoundaryMarker, pos);
                    size_t endMarker = description.find(dataBoundaryMarker, startMarker + 1);
                    std::string importInfo = description.substr(startMarker + 1, endMarker - startMarker - 1);
                    auto ss = split(importInfo);
                    os << "  -> " << type << " '" << ss[0] << "' importing '" << ss[1] << "' from '" << ss[2] << "'";
                    originalDescriptionStart = endMarker + 1;
                    pos = description.find(notOriginMarker, pos + 1);
                    depth += 1;
                    if (pos == std::string::npos) {
                        if (depth > 1) {
                            os << " which";
                        }
                        os << " has an error:" << std::endl
                           << "   - ";
                    } else {
                        os << " imports:" << std::endl;
                    }
                }

                if (depth > 0) {
                    if (type == "Component") {
                        issue->mPimpl->mItem->mPimpl->setComponent(component);
                    } else {
                        issue->mPimpl->mItem->mPimpl->setUnits(units);
                    }
                }

                os << description.substr(originalDescriptionStart);
                issue->mPimpl->setDescription(os.str());
            } else {
                // Get name, reference, and import source from history.
                auto h = history.back();
                os << notOriginMarker << dataBoundaryMarker << h->mName << dataSeparator << h->mReferenceName << dataSeparator << h->mDestinationUrl << dataBoundaryMarker << description;
                issue->mPimpl->setDescription(os.str());
            }
        }
    }
}